

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obs2gal.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  bool bVar1;
  double date_00;
  CESkyCoord gal_coords;
  CEDate date;
  CESkyCoord obs_coords;
  CEObserver observer;
  CEExecOptions opts;
  allocator local_3f6;
  allocator local_3f5;
  CESkyCoordType local_3f4;
  CESkyCoord local_3f0;
  double local_3c0;
  CEAngle local_3b8;
  CEDate local_3a8;
  CESkyCoord local_368;
  CEAngle local_338;
  undefined8 local_328;
  string local_320;
  CEObserver local_300;
  CEExecOptions local_250;
  
  DefineOpts();
  bVar1 = CLOptions::ParseCommandLine(&local_250.super_CLOptions,argc,argv);
  if (!bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_3a8,"longitude",(allocator *)&local_3c0);
    local_320._M_dataplus._M_p =
         (pointer)CLOptions::AsDouble(&local_250.super_CLOptions,(string *)&local_3a8);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_368,"latitude",(allocator *)&local_3f4);
    local_3b8._vptr_CEAngle =
         (_func_int **)CLOptions::AsDouble(&local_250.super_CLOptions,(string *)&local_368);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_3f0,"elevation",&local_3f6);
    local_338._vptr_CEAngle =
         (_func_int **)CLOptions::AsDouble(&local_250.super_CLOptions,(string *)&local_3f0);
    local_328 = (double)((ulong)local_328._4_4_ << 0x20);
    CEObserver::CEObserver
              (&local_300,(double *)&local_320,(double *)&local_3b8,(double *)&local_338,
               (CEAngleType *)&local_328);
    std::__cxx11::string::~string((string *)&local_3f0);
    __gnu_cxx::new_allocator<char>::~new_allocator((new_allocator<char> *)&local_3f6);
    std::__cxx11::string::~string((string *)&local_368);
    __gnu_cxx::new_allocator<char>::~new_allocator((new_allocator<char> *)&local_3f4);
    std::__cxx11::string::~string((string *)&local_3a8);
    __gnu_cxx::new_allocator<char>::~new_allocator((new_allocator<char> *)&local_3c0);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_3a8,"pressure",(allocator *)&local_3f0);
    local_368._vptr_CESkyCoord =
         (_func_int **)CLOptions::AsDouble(&local_250.super_CLOptions,(string *)&local_3a8);
    CEObserver::SetPressure_hPa(&local_300,(double *)&local_368);
    std::__cxx11::string::~string((string *)&local_3a8);
    __gnu_cxx::new_allocator<char>::~new_allocator((new_allocator<char> *)&local_3f0);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_3a8,"temperature",(allocator *)&local_3f0);
    local_368._vptr_CESkyCoord =
         (_func_int **)CLOptions::AsDouble(&local_250.super_CLOptions,(string *)&local_3a8);
    CEObserver::SetTemperature_C(&local_300,(double *)&local_368);
    std::__cxx11::string::~string((string *)&local_3a8);
    __gnu_cxx::new_allocator<char>::~new_allocator((new_allocator<char> *)&local_3f0);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_3a8,"humidity",(allocator *)&local_3f0);
    local_368._vptr_CESkyCoord =
         (_func_int **)CLOptions::AsDouble(&local_250.super_CLOptions,(string *)&local_3a8);
    CEObserver::SetRelativeHumidity(&local_300,(double *)&local_368);
    std::__cxx11::string::~string((string *)&local_3a8);
    __gnu_cxx::new_allocator<char>::~new_allocator((new_allocator<char> *)&local_3f0);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_3a8,"wavelength",(allocator *)&local_3f0);
    local_368._vptr_CESkyCoord =
         (_func_int **)CLOptions::AsDouble(&local_250.super_CLOptions,(string *)&local_3a8);
    CEObserver::SetWavelength_um(&local_300,(double *)&local_368);
    std::__cxx11::string::~string((string *)&local_3a8);
    __gnu_cxx::new_allocator<char>::~new_allocator((new_allocator<char> *)&local_3f0);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_368,"juliandate",(allocator *)&local_3f0);
    date_00 = CLOptions::AsDouble(&local_250.super_CLOptions,(string *)&local_368);
    CEDate::CEDate(&local_3a8,date_00,JD);
    std::__cxx11::string::~string((string *)&local_368);
    __gnu_cxx::new_allocator<char>::~new_allocator((new_allocator<char> *)&local_3f0);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_3f0,"azimuth",&local_3f6);
    local_328 = CLOptions::AsDouble(&local_250.super_CLOptions,(string *)&local_3f0);
    CEAngle::Deg(&local_3b8,(double *)&local_328);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_320,"zenith",&local_3f5);
    local_3c0 = CLOptions::AsDouble(&local_250.super_CLOptions,&local_320);
    CEAngle::Deg(&local_338,&local_3c0);
    local_3f4 = OBSERVED;
    CESkyCoord::CESkyCoord(&local_368,&local_3b8,&local_338,&local_3f4);
    CEAngle::~CEAngle(&local_338);
    std::__cxx11::string::~string((string *)&local_320);
    __gnu_cxx::new_allocator<char>::~new_allocator((new_allocator<char> *)&local_3f5);
    CEAngle::~CEAngle(&local_3b8);
    std::__cxx11::string::~string((string *)&local_3f0);
    __gnu_cxx::new_allocator<char>::~new_allocator((new_allocator<char> *)&local_3f6);
    CESkyCoord::ConvertToGalactic(&local_3f0,&local_368,&local_3a8,&local_300);
    PrintResults(&local_250,&local_3f0);
    CESkyCoord::~CESkyCoord(&local_3f0);
    CESkyCoord::~CESkyCoord(&local_368);
    CEDate::~CEDate(&local_3a8);
    CEObserver::~CEObserver(&local_300);
  }
  CEExecOptions::~CEExecOptions(&local_250);
  return 0;
}

Assistant:

int main(int argc, char** argv) {
    
    // Parse the command line options
    CEExecOptions opts = DefineOpts() ;
    if (opts.ParseCommandLine(argc, argv)) return 0;
    
    // Define the observer
    CEObserver observer(opts.AsDouble("longitude"),
                        opts.AsDouble("latitude"),
                        opts.AsDouble("elevation"),
                        CEAngleType::DEGREES);
    observer.SetPressure_hPa(opts.AsDouble("pressure"));
    observer.SetTemperature_C(opts.AsDouble("temperature"));
    observer.SetRelativeHumidity(opts.AsDouble("humidity"));
    observer.SetWavelength_um(opts.AsDouble("wavelength"));

    // Define the date
    CEDate date(opts.AsDouble("juliandate"), CEDateType::JD);

    // Convert the coordinates
    CESkyCoord obs_coords(CEAngle::Deg(opts.AsDouble("azimuth")),
                          CEAngle::Deg(opts.AsDouble("zenith")),
                          CESkyCoordType::OBSERVED);
    CESkyCoord gal_coords = obs_coords.ConvertToGalactic(date, observer);
    
    // Print the results
    PrintResults(opts, gal_coords);
    
    return 0;
}